

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::FillColumnRevSubClampPalCommand::Execute
          (FillColumnRevSubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  int core_skip;
  byte *pbVar7;
  int iVar8;
  int pass_skip;
  uint uVar9;
  uint uVar10;
  
  uVar9 = *(uint *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  if (0 < (int)uVar9) {
    iVar8 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
    uVar10 = thread->pass_end_y - iVar8;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    if (uVar9 < uVar10) {
      uVar10 = uVar9;
    }
    uVar9 = thread->pass_start_y - iVar8;
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    iVar1 = thread->num_cores;
    iVar8 = (iVar1 - (int)((iVar8 + uVar9) - thread->core) % iVar1) % iVar1;
    uVar5 = (long)(int)((~uVar9 + iVar1 + uVar10) - iVar8) / (long)iVar1;
    uVar6 = uVar5 & 0xffffffff;
    if (0 < (int)uVar5) {
      puVar4 = (this->super_PalColumnCommand)._destblend;
      uVar2 = (this->super_PalColumnCommand)._srccolor;
      iVar3 = (this->super_PalColumnCommand)._pitch;
      pbVar7 = (this->super_PalColumnCommand)._dest + (int)((iVar8 + uVar9) * iVar3);
      do {
        uVar9 = (puVar4[*pbVar7] | 0x40100400) - uVar2;
        uVar10 = uVar9 & 0x40100400;
        uVar9 = uVar10 - (uVar10 >> 5) & uVar9 | 0x1f07c1f;
        *pbVar7 = RGB32k.All[uVar9 >> 0xf & uVar9];
        pbVar7 = pbVar7 + iVar1 * iVar3;
        uVar9 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

void FillColumnRevSubClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;
		if (count <= 0)
			return;

		dest = _dest;
		uint32_t *bg2rgb;
		uint32_t fg;

		bg2rgb = _destblend;
		fg = _srccolor;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		do
		{
			uint32_t a = (bg2rgb[*dest] | 0x40100400) - fg;
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
		} while (--count);
	}